

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O2

void mesh_Initialize(Node_status *node_status,double *space_coordinate,Grid *grid)

{
  uint uVar1;
  ulong uVar2;
  
  *node_status = LEFT;
  node_status[grid->X_nodes - 1] = RIGHT;
  for (uVar2 = 1; uVar1 = grid->X_nodes, uVar2 < uVar1 - 1; uVar2 = uVar2 + 1) {
    node_status[uVar2] = MIDDLE;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    space_coordinate[uVar2] = (double)(uVar2 & 0xffffffff) * grid->X_step;
  }
  return;
}

Assistant:

void mesh_Initialize (Node_status * node_status, double * space_coordinate, Grid * grid) {
  unsigned space_step;
  node_status[0] = LEFT;
  node_status[grid->X_nodes - 1] = RIGHT;
  for (space_step = 1; space_step < grid->X_nodes - 1; ++space_step) {
    node_status[space_step] = MIDDLE;
  }

  for (space_step = 0; space_step < grid->X_nodes; ++space_step) {
    space_coordinate[space_step] = space_step * grid->X_step;
  }

  return;
}